

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klass.cpp
# Opt level: O0

int main(void)

{
  squirrel_error *e;
  string local_1a8 [36];
  Foo2 local_184;
  code *pcStack_180;
  Foo2 foo2;
  allocator local_169;
  string local_168 [32];
  undefined1 local_148 [8];
  Klass<Foo2,_Foo> k_1;
  string local_128 [39];
  allocator local_101;
  string local_100 [36];
  Foo local_dc;
  code *pcStack_d8;
  Foo foo;
  allocator local_b1;
  string local_b0 [32];
  undefined1 local_90 [8];
  Klass<Foo,_void> k;
  undefined1 local_68 [8];
  VMStd vm;
  
  vm.super_VM.root_table_._M_t.
  super___uniq_ptr_impl<squall::TableBase,_std::default_delete<squall::TableBase>_>._M_t.
  super__Tuple_impl<0UL,_squall::TableBase_*,_std::default_delete<squall::TableBase>_>.
  super__Head_base<0UL,_squall::TableBase_*,_false>._M_head_impl._4_4_ = 0;
  squall::VMStd::VMStd((VMStd *)local_68,0x400);
  squall::VMStd::dofile((VMStd *)local_68,"klass.nut");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"Foo",&local_b1);
  squall::Klass<Foo,_void>::Klass((Klass<Foo,_void> *)local_90,(VM *)local_68,(string *)local_b0);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  squall::Klass<Foo,void>::func<void(Foo::*)()>((Klass<Foo,void> *)local_90,"bar",0x1084c0);
  pcStack_d8 = Foo::baz;
  squall::Klass<Foo,void>::func<int(Foo::*)(std::__cxx11::string_const&)>
            ((Klass<Foo,void> *)local_90,"baz",0x108610);
  Foo::Foo(&local_dc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"zot",&local_101);
  squall::VM::call<void,Foo*>((VM *)local_68,(string *)local_100,&local_dc);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  squall::Klass<Foo,void>::func<main::__0>((Klass<Foo,void> *)local_90,"qux");
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_128,"quux",
             (allocator *)
             ((long)&k_1.imp_.
                     super___weak_ptr<squall::detail::KlassImp<Foo2>,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  squall::VM::call<void,Foo*>((VM *)local_68,(string *)local_128,&local_dc);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&k_1.imp_.
                     super___weak_ptr<squall::detail::KlassImp<Foo2>,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  squall::Klass<Foo,_void>::~Klass((Klass<Foo,_void> *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"Foo2",&local_169);
  squall::Klass<Foo2,_Foo>::Klass((Klass<Foo2,_Foo> *)local_148,(VM *)local_68,(string *)local_168);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  pcStack_180 = Foo2::bar2;
  squall::Klass<Foo2,Foo>::func<void(Foo2::*)()>((Klass<Foo2,Foo> *)local_148,"bar2",0x1088c0);
  Foo2::Foo2(&local_184);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"zot2",(allocator *)((long)&e + 7));
  squall::VM::call<void,Foo2*>((VM *)local_68,(string *)local_1a8,&local_184);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  squall::Klass<Foo2,_Foo>::~Klass((Klass<Foo2,_Foo> *)local_148);
  squall::VMStd::~VMStd((VMStd *)local_68);
  return 0;
}

Assistant:

int main() {
    try {
        squall::VMStd vm;
        vm.dofile("klass.nut");

        {
            squall::Klass<Foo> k(vm, "Foo");
            k.func("bar", &Foo::bar);
            k.func("baz", &Foo::baz);

            Foo foo;
            vm.call<void>("zot", &foo);

            k.func("qux", [](Foo* x, const std::string& y) {
                    std::cerr << "**** qux called: " << y << std::endl;
                    x->baz(y);
                });
            vm.call<void>("quux", &foo);
        }

        {
            squall::Klass<Foo2, Foo> k(vm, "Foo2");
            k.func("bar2", &Foo2::bar2);

            Foo2 foo2;
            vm.call<void>("zot2", &foo2);
        }
    }
    catch(squall::squirrel_error& e) {
        std::cerr << e.what() << std::endl;
    }

    return 0;
}